

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::SetStackSize(SQFuncState *this,SQInteger n)

{
  long in_RSI;
  SQLocalVarInfo *in_RDI;
  SQLocalVarInfo lvi;
  SQInteger size;
  sqvector<SQLocalVarInfo> *in_stack_ffffffffffffffb0;
  SQLocalVarInfo *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  SQUnsignedInteger local_18;
  
  local_18 = sqvector<SQLocalVarInfo>::size
                       ((sqvector<SQLocalVarInfo> *)&(in_RDI->_name).super_SQObject._unVal);
  while (in_RSI < (long)local_18) {
    local_18 = local_18 - 1;
    sqvector<SQLocalVarInfo>::back
              ((sqvector<SQLocalVarInfo> *)&(in_RDI->_name).super_SQObject._unVal);
    SQLocalVarInfo::SQLocalVarInfo
              ((SQLocalVarInfo *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    if (in_stack_ffffffffffffffc0 != 0x1000001) {
      if (local_28 == -1) {
        in_RDI[0xb]._start_op = in_RDI[0xb]._start_op - 1;
      }
      local_28 = GetCurrentPos((SQFuncState *)0x11ce82);
      sqvector<SQLocalVarInfo>::push_back(in_stack_ffffffffffffffb0,in_RDI);
    }
    sqvector<SQLocalVarInfo>::pop_back((sqvector<SQLocalVarInfo> *)0x11ced5);
    SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)0x11cee1);
  }
  return;
}

Assistant:

void SQFuncState::SetStackSize(SQInteger n)
{
    SQInteger size=_vlocals.size();
    while(size>n){
        size--;
        SQLocalVarInfo lvi = _vlocals.back();
        if(sq_type(lvi._name)!=OT_NULL){
            if(lvi._end_op == UINT_MINUS_ONE) { //this means is an outer
                _outers--;
            }
            lvi._end_op = GetCurrentPos();
            _localvarinfos.push_back(lvi);
        }
        _vlocals.pop_back();
    }
}